

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O3

void stb__arr_deleten_(void **pp,int size,int i,int n)

{
  void *pvVar1;
  int iVar2;
  
  pvVar1 = *pp;
  if (n != 0) {
    if (pvVar1 == (void *)0x0) {
      iVar2 = 0;
    }
    else {
      iVar2 = *(int *)((long)pvVar1 + -0x10);
    }
    memmove((void *)((long)(i * size) + (long)pvVar1),
            (void *)((long)((n + i) * size) + (long)pvVar1),(long)((iVar2 - (n + i)) * size));
    *(int *)((long)pvVar1 + -0x10) = *(int *)((long)pvVar1 + -0x10) - n;
  }
  *pp = pvVar1;
  return;
}

Assistant:

void stb__arr_deleten_(void **pp, int size, int i, int n  STB__PARAMS)
{
   void *p = *pp;
   if (n) {
      memmove((char *) p + i*size, (char *) p + (i+n)*size, size * (stb_arr_len2(p)-(i+n)));
      stb_arrhead2(p)->len -= n;
   }
   *pp = p;
}